

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O2

int __thiscall QHexView::copy(QHexView *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QHexDocument *pQVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  QHexBuffer *pQVar4;
  bool bVar5;
  int extraout_EAX;
  undefined8 uVar6;
  void *__buf;
  undefined1 local_68 [16];
  QHexBuffer *local_58;
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char> local_30;
  
  uVar6 = QGuiApplication::clipboard();
  bVar5 = QHexCursor::hasSelection(this->m_hexcursor);
  if (bVar5) {
    QHexCursor::selectedBytes((QByteArray *)local_68,this->m_hexcursor);
  }
  else {
    pQVar1 = this->m_hexdocument;
    __buf = (void *)QHexCursor::offset(this->m_hexcursor);
    QHexDocument::read((QHexDocument *)local_68,(int)pQVar1,__buf,1);
  }
  if ((char)dst != '\0') {
    QHexUtils::toHex((QByteArray *)&local_30,(QByteArray *)local_68,' ');
    QByteArray::toUpper_helper((QByteArray *)&local_48);
    pQVar4 = local_58;
    uVar3 = local_68._8_8_;
    uVar2 = local_68._0_8_;
    local_68._0_8_ = local_48.d;
    local_68._8_8_ = local_48.ptr;
    local_48.d = (Data *)uVar2;
    local_48.ptr = (char16_t *)uVar3;
    local_58 = (QHexBuffer *)local_48.size;
    local_48.size = (qsizetype)pQVar4;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_48);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
  }
  QString::QString((QString *)&local_48,(QByteArray *)local_68);
  QClipboard::setText(uVar6,&local_48,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_68);
  return extraout_EAX;
}

Assistant:

void QHexView::copy(bool hex) const {
    QClipboard* c = qApp->clipboard();

    QByteArray bytes = m_hexcursor->hasSelection()
                           ? m_hexcursor->selectedBytes()
                           : m_hexdocument->read(m_hexcursor->offset(), 1);

    if(hex)
        bytes = QHexUtils::toHex(bytes, ' ').toUpper();
    c->setText(bytes);
}